

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateExternalFunction_TTD(JavascriptLibrary *this,Var fname)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptExternalFunction *this_00;
  
  if (((ulong)fname & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)fname & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)fname & 0xffff000000000000) != 0x1000000000000) goto LAB_00bec852;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00bec8a4;
    *puVar3 = 0;
  }
  if (((ulong)fname & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00bec8a4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = ScriptContext::IsTrackedPropertyId
                    ((this->super_JavascriptLibraryBase).scriptContext.ptr,(PropertyId)fname);
  if (!bVar2) {
    ScriptContext::TrackPid((this->super_JavascriptLibraryBase).scriptContext.ptr,(PropertyId)fname)
    ;
  }
LAB_00bec852:
  this_00 = CreateIdMappedExternalFunction<void*(*)(void*,void**,unsigned_short,Js::StdCallJavascriptMethodInfo*,void*)>
                      (this,JavascriptExternalFunction::TTDReplayDummyExternalMethod,
                       (this->stdCallFunctionWithDeferredPrototypeType).ptr);
  RuntimeFunction::SetFunctionNameId(&this_00->super_RuntimeFunction,fname);
  Memory::Recycler::WBSetBit((char *)&this_00->callbackState);
  (this_00->callbackState).ptr = (void *)0x0;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_00->callbackState);
  return (RecyclableObject *)this_00;
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateExternalFunction_TTD(Js::Var fname)
    {
        if(TaggedInt::Is(fname))
        {
            PropertyId pid = TaggedInt::ToInt32(fname);
            if(!scriptContext->IsTrackedPropertyId(pid))
            {
                scriptContext->TrackPid(pid);
            }
        }

        JavascriptExternalFunction* function = this->CreateIdMappedExternalFunction(&JavascriptExternalFunction::TTDReplayDummyExternalMethod, stdCallFunctionWithDeferredPrototypeType);
        function->SetFunctionNameId(fname);
        function->SetCallbackState(nullptr);
        return function;
    }